

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O2

int Wlc_NtkAbsCore(Wlc_Ntk_t *p,Wlc_Par_t *pPars)

{
  Abc_Cex_t *pCex;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Bit_t *p_00;
  Vec_Bit_t *pVVar6;
  Wlc_Ntk_t *p_01;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p_02;
  Wlc_Obj_t *pWVar8;
  ulong uVar9;
  Wlc_Par_t *pWVar10;
  Gia_Man_t *pGVar11;
  Gia_Man_t *p_03;
  Aig_Man_t *pAig;
  Wlc_Par_t *vRefine;
  abctime aVar12;
  char *pcVar13;
  Vec_Int_t **extraout_RDX;
  Vec_Int_t **extraout_RDX_00;
  Vec_Int_t **pvFlops;
  abctime time;
  Wlc_Par_t *pWVar14;
  uint i;
  char *__format;
  uint uVar15;
  uint local_134;
  Vec_Int_t *local_128;
  Vec_Int_t *vBlacks;
  int local_10c;
  uint local_108;
  uint local_104;
  int local_100;
  uint local_fc;
  abctime local_f8;
  Pdr_Par_t PdrPars;
  
  pWVar10 = pPars;
  local_f8 = Abc_Clock();
  vBlacks = (Vec_Int_t *)0x0;
  p_00 = Vec_BitStart(p->iObj);
  Pdr_ManSetDefaultParams(&PdrPars);
  PdrPars.fVerbose = pPars->fPdrVerbose;
  PdrPars.fVeryVerbose = 0;
  pWVar14 = (Wlc_Par_t *)0x1;
  local_134 = -1;
  do {
    uVar5 = (uint)pWVar14;
    if (pPars->nIterMax <= (int)uVar5) {
LAB_006d792c:
      Vec_IntFree(vBlacks);
      Vec_BitFree(p_00);
      if (pPars->fVerbose != 0) {
        putchar(10);
      }
      printf("Abstraction ");
      pcVar13 = "timed out";
      if (local_134 == 1) {
        pcVar13 = "is successfully proved";
      }
      __format = "resulted in a real CEX";
      if (local_134 != 0) {
        __format = pcVar13;
      }
      printf(__format);
      printf(" after %d iterations. ",pWVar14);
      aVar12 = Abc_Clock();
      Abc_PrintTime(0x816bba,(char *)(aVar12 - local_f8),time);
      return local_134;
    }
    if (pPars->fVerbose != 0) {
      pWVar10 = pWVar14;
      printf("\nIteration %d:\n");
    }
    if (pPars->fAbs2 == 0) {
      if ((uVar5 == 1) && (pPars->nLimit < 1000000000)) {
        pWVar10 = pPars;
        pVVar6 = Wlc_NtkMarkLimit(p,pPars);
        uVar15 = pVVar6->nSize;
        i = 0;
        if ((int)uVar15 < 1) {
          uVar15 = 0;
          i = 0;
        }
        for (; uVar15 != i; i = i + 1) {
          uVar1 = Vec_BitEntry(pVVar6,i);
          pWVar10 = (Wlc_Par_t *)(ulong)i;
          Vec_BitWriteEntry(p_00,i,uVar1 ^ 1);
        }
        Vec_BitFree(pVVar6);
      }
      local_100 = pPars->fVerbose;
      local_fc = uVar5;
      pVVar7 = Vec_IntAlloc(100);
      local_128 = Vec_IntAlloc(100);
      p_02 = Vec_IntAlloc(100);
      pVVar6 = Vec_BitStart(p->iObj);
      local_104 = 0;
      local_134 = 0;
      local_108 = 0;
      local_10c = 0;
      pWVar14 = (Wlc_Par_t *)0x1;
      while (iVar3 = (int)pWVar14, iVar3 < p->iObj) {
        pWVar10 = pWVar14;
        pWVar8 = Wlc_NtkObj(p,iVar3);
        if (p_00 == (Vec_Bit_t *)0x0) {
LAB_006d752a:
          pWVar14 = pWVar10;
          uVar5 = *(ushort *)pWVar8 & 0x3f;
          if (uVar5 < 0x33) {
            if ((0x1e00000000000U >> uVar5 & 1) == 0) {
              if ((0x4180000000000U >> uVar5 & 1) == 0) {
                if (uVar5 != 8) goto LAB_006d7627;
                iVar2 = pWVar8->End - pWVar8->Beg;
                iVar4 = -iVar2;
                if (0 < iVar2) {
                  iVar4 = iVar2;
                }
                if (pPars->nBitsMux <= iVar4 + 1) {
                  uVar9 = ((long)pWVar8 - (long)p->pObjs) / 0x18;
                  pWVar14 = (Wlc_Par_t *)(uVar9 & 0xffffffff);
                  Vec_BitWriteEntry(pVVar6,(int)uVar9,1);
                  local_108 = local_108 + 1;
                }
              }
              else {
                iVar2 = pWVar8->End - pWVar8->Beg;
                iVar4 = -iVar2;
                if (0 < iVar2) {
                  iVar4 = iVar2;
                }
                if (pPars->nBitsAdd <= iVar4 + 1) {
                  uVar9 = ((long)pWVar8 - (long)p->pObjs) / 0x18;
                  pWVar14 = (Wlc_Par_t *)(uVar9 & 0xffffffff);
                  Vec_BitWriteEntry(pVVar6,(int)uVar9,1);
                  local_104 = local_104 + 1;
                }
              }
            }
            else {
              iVar2 = pWVar8->End - pWVar8->Beg;
              iVar4 = -iVar2;
              if (0 < iVar2) {
                iVar4 = iVar2;
              }
              if (pPars->nBitsMul <= iVar4 + 1) {
                uVar9 = ((long)pWVar8 - (long)p->pObjs) / 0x18;
                pWVar14 = (Wlc_Par_t *)(uVar9 & 0xffffffff);
                Vec_BitWriteEntry(pVVar6,(int)uVar9,1);
                local_134 = local_134 + 1;
              }
            }
          }
          else {
LAB_006d7627:
            if ((short)uVar5 != 1 && (*(ushort *)pWVar8 & 0x3d) == 1) {
              iVar2 = pWVar8->End - pWVar8->Beg;
              iVar4 = -iVar2;
              if (0 < iVar2) {
                iVar4 = iVar2;
              }
              if (pPars->nBitsFlop <= iVar4 + 1) {
                uVar9 = ((long)pWVar8 - (long)p->pObjs) / 0x18;
                pWVar14 = (Wlc_Par_t *)(uVar9 & 0xffffffff);
                Vec_BitWriteEntry(pVVar6,(int)uVar9,1);
                local_10c = local_10c + 1;
              }
            }
          }
        }
        else {
          iVar4 = Vec_BitEntry(p_00,iVar3);
          pWVar10 = pWVar14;
          if (iVar4 == 0) goto LAB_006d752a;
        }
        pWVar10 = pWVar14;
        pWVar14 = (Wlc_Par_t *)(ulong)(iVar3 + 1);
      }
      if (local_100 != 0) {
        pWVar10 = (Wlc_Par_t *)(ulong)local_104;
        printf("Abstraction engine marked %d adds/subs, %d muls/divs, %d muxes, and %d flops to be abstracted away.\n"
               ,pWVar10,(ulong)local_134,(ulong)local_108);
      }
      Wlc_NtkCleanMarks(p);
      for (iVar3 = 0; iVar3 < (p->vCos).nSize; iVar3 = iVar3 + 1) {
        pWVar10 = (Wlc_Par_t *)Wlc_NtkCo(p,iVar3);
        Wlc_NtkAbsMarkNodes_rec(p,(Wlc_Obj_t *)pWVar10,pVVar6,pVVar7,local_128,p_02);
      }
      for (iVar3 = 0; iVar3 < p_02->nSize; iVar3 = iVar3 + 1) {
        iVar4 = Vec_IntEntry(p_02,iVar3);
        pWVar8 = Wlc_NtkObj(p,iVar4);
        pWVar10 = (Wlc_Par_t *)Wlc_ObjFo2Fi(p,pWVar8);
        Wlc_NtkAbsMarkNodes_rec(p,(Wlc_Obj_t *)pWVar10,pVVar6,pVVar7,local_128,p_02);
      }
      pWVar14 = (Wlc_Par_t *)0x1;
      while( true ) {
        iVar4 = (int)pWVar10;
        iVar3 = (int)pWVar14;
        if (p->iObj <= iVar3) break;
        pWVar10 = pWVar14;
        Wlc_NtkObj(p,iVar3);
        pWVar14 = (Wlc_Par_t *)(ulong)(iVar3 + 1);
      }
      Vec_IntSort(pVVar7,iVar4);
      Vec_IntSort(local_128,iVar4);
      Vec_IntSort(p_02,iVar4);
      Wlc_NtkCleanMarks(p);
      Vec_BitFree(pVVar6);
      p_01 = Wlc_NtkDupDfsAbs(p,pVVar7,local_128,p_02);
      Vec_IntFree(pVVar7);
      Vec_IntFree(p_02);
      pWVar14 = (Wlc_Par_t *)(ulong)local_fc;
    }
    else {
      if (vBlacks == (Vec_Int_t *)0x0) {
        vBlacks = Wlc_NtkGetBlacks(p,pPars);
        pvFlops = extraout_RDX_00;
      }
      else {
        Wlc_NtkUpdateBlacks(p,pPars,&vBlacks,p_00,(Vec_Int_t *)0x0);
        pvFlops = extraout_RDX;
      }
      pVVar7 = vBlacks;
      p_01 = Wlc_NtkAbs2(p,vBlacks,pvFlops);
      local_128 = Vec_IntDup(pVVar7);
    }
    pGVar11 = Wlc_NtkBitBlast(p_01,(Wlc_BstPar_t *)0x0);
    iVar3 = Wlc_NtkDcFlopNum(p_01);
    p_03 = pGVar11;
    if (0 < iVar3) {
      iVar4 = Wlc_NtkCountObjBits(p,local_128);
      p_03 = Gia_ManPermuteInputs(pGVar11,iVar4,iVar3);
      Gia_ManStop(pGVar11);
    }
    pGVar11 = p_03;
    if (pPars->fXorOutput != 0) {
      pGVar11 = Gia_ManTransformMiter2(p_03);
      Gia_ManStop(p_03);
    }
    if (pPars->fVerbose != 0) {
      printf("Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n",
             (ulong)(p_01->iObj - 1),(ulong)(uint)local_128->nSize);
      Gia_ManPrintStats(pGVar11,(Gps_Par_t *)0x0);
    }
    Wlc_NtkFree(p_01);
    pAig = Gia_ManToAigSimple(pGVar11);
    local_134 = Pdr_ManSolve(pAig,&PdrPars);
    pCex = pAig->pSeqModel;
    pAig->pSeqModel = (Abc_Cex_t *)0x0;
    Aig_ManStop(pAig);
    if (pCex == (Abc_Cex_t *)0x0) {
      if (local_134 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                      ,0x74a,"int Wlc_NtkAbsCore(Wlc_Ntk_t *, Wlc_Par_t *)");
      }
      Gia_ManStop(pGVar11);
      Vec_IntFree(local_128);
      goto LAB_006d792c;
    }
    vRefine = (Wlc_Par_t *)Wlc_NtkAbsRefinement(p,pGVar11,pCex,local_128);
    Gia_ManStop(pGVar11);
    Vec_IntFree(local_128);
    if (vRefine == (Wlc_Par_t *)0x0) {
      Abc_CexFree(pCex);
      goto LAB_006d792c;
    }
    pWVar10 = vRefine;
    uVar5 = Wlc_NtkRemoveFromAbstraction(p,(Vec_Int_t *)vRefine,p_00);
    if (pPars->fVerbose != 0) {
      pWVar10 = (Wlc_Par_t *)(ulong)(uint)pCex->iFrame;
      printf("Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n"
             ,pWVar10,(ulong)(uint)vRefine->nBitsMul,(ulong)uVar5);
    }
    Vec_IntFree((Vec_Int_t *)vRefine);
    Abc_CexFree(pCex);
    pWVar14 = (Wlc_Par_t *)(ulong)((int)pWVar14 + 1);
  } while( true );
}

Assistant:

int Wlc_NtkAbsCore( Wlc_Ntk_t * p, Wlc_Par_t * pPars )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vBlacks = NULL;
    int nIters, nNodes, nDcFlops, RetValue = -1;
    // start the bitmap to mark objects that cannot be abstracted because of refinement
    // currently, this bitmap is empty because abstraction begins without refinement
    Vec_Bit_t * vUnmark = Vec_BitStart( Wlc_NtkObjNumMax(p) );
    // set up parameters to run PDR
    Pdr_Par_t PdrPars, * pPdrPars = &PdrPars;
    Pdr_ManSetDefaultParams( pPdrPars );
    //pPdrPars->fUseAbs    = 1;   // use 'pdr -t'  (on-the-fly abstraction)
    //pPdrPars->fCtgs      = 1;   // use 'pdr -nc' (improved generalization)
    //pPdrPars->fSkipDown  = 0;   // use 'pdr -nc' (improved generalization)
    //pPdrPars->nRestLimit = 500; // reset queue or proof-obligations when it gets larger than this
    pPdrPars->fVerbose   = pPars->fPdrVerbose;
    pPdrPars->fVeryVerbose = 0;
    // perform refinement iterations
    for ( nIters = 1; nIters < pPars->nIterMax; nIters++ )
    {
        Aig_Man_t * pAig;
        Abc_Cex_t * pCex;
        Vec_Int_t * vPisNew, * vRefine;  
        Gia_Man_t * pGia, * pTemp;
        Wlc_Ntk_t * pAbs;

        if ( pPars->fVerbose )
            printf( "\nIteration %d:\n", nIters );

        // get abstracted GIA and the set of pseudo-PIs (vPisNew)
        if ( pPars->fAbs2 )
        {
            if ( vBlacks == NULL )
                vBlacks = Wlc_NtkGetBlacks( p, pPars );
            else
                Wlc_NtkUpdateBlacks( p, pPars, &vBlacks, vUnmark, NULL );
            pAbs = Wlc_NtkAbs2( p, vBlacks, NULL );
            vPisNew = Vec_IntDup( vBlacks );
        }
        else
        {
            if ( nIters == 1 && pPars->nLimit < ABC_INFINITY )
                Wlc_NtkSetUnmark( p, pPars, vUnmark );

            pAbs = Wlc_NtkAbs( p, pPars, vUnmark, &vPisNew, NULL, pPars->fVerbose );
        }
        pGia = Wlc_NtkBitBlast( pAbs, NULL );

        // if the abstraction has flops with DC-init state,
        // new PIs were introduced by bit-blasting at the end of the PI list
        // here we move these variables to be *before* PPIs, because
        // PPIs are supposed to be at the end of the PI list for refinement
        nDcFlops = Wlc_NtkDcFlopNum(pAbs);
        if ( nDcFlops > 0 ) // DC-init flops are present
        {
            pGia = Gia_ManPermuteInputs( pTemp = pGia, Wlc_NtkCountObjBits(p, vPisNew), nDcFlops );
            Gia_ManStop( pTemp );
        }
        // if the word-level outputs have to be XORs, this is a place to do it
        if ( pPars->fXorOutput )
        {
            pGia = Gia_ManTransformMiter2( pTemp = pGia );
            Gia_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
        {
            printf( "Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n", Wlc_NtkObjNum(pAbs), Vec_IntSize(vPisNew) ); 
            Gia_ManPrintStats( pGia, NULL );
        }
        Wlc_NtkFree( pAbs );

        // try to prove abstracted GIA by converting it to AIG and calling PDR
        pAig = Gia_ManToAigSimple( pGia );
        RetValue = Pdr_ManSolve( pAig, pPdrPars );
        pCex = pAig->pSeqModel; pAig->pSeqModel = NULL;
        Aig_ManStop( pAig );

        // consider outcomes
        if ( pCex == NULL ) 
        {
            assert( RetValue ); // proved or undecided
            Gia_ManStop( pGia );
            Vec_IntFree( vPisNew );
            break;
        }

        // perform refinement
        vRefine = Wlc_NtkAbsRefinement( p, pGia, pCex, vPisNew );
        Gia_ManStop( pGia );
        Vec_IntFree( vPisNew );
        if ( vRefine == NULL ) // real CEX
        {
            Abc_CexFree( pCex ); // return CEX in the future
            break;
        }

        // update the set of objects to be un-abstracted
        nNodes = Wlc_NtkRemoveFromAbstraction( p, vRefine, vUnmark );
        if ( pPars->fVerbose )
            printf( "Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n", pCex->iFrame, Vec_IntSize(vRefine), nNodes );
        Vec_IntFree( vRefine );
        Abc_CexFree( pCex );
    }
    Vec_IntFree( vBlacks );
    Vec_BitFree( vUnmark );
    // report the result
    if ( pPars->fVerbose )
        printf( "\n" );
    printf( "Abstraction " );
    if ( RetValue == 0 )
        printf( "resulted in a real CEX" );
    else if ( RetValue == 1 )
        printf( "is successfully proved" );
    else 
        printf( "timed out" );
    printf( " after %d iterations. ", nIters );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return RetValue;
}